

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall crnlib::dxt_image::flip_col(dxt_image *this,uint x)

{
  byte bVar1;
  uint8 uVar2;
  uint8 uVar3;
  element_type eVar4;
  uint value;
  uint value_00;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint bit_ofs;
  int iVar8;
  uint x_2;
  uint x_00;
  undefined4 in_register_00000034;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint y;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint y_1;
  uint y_00;
  uint uVar16;
  dxt3_block *this_00;
  ulong uVar17;
  element tmp [2];
  dxt3_block local_78 [3];
  uint8 *local_60;
  undefined8 local_58;
  ulong local_50;
  dxt_image *local_48;
  ulong local_40;
  long local_38;
  
  uVar9 = CONCAT44(in_register_00000034,x);
  if (this->m_blocks_y != 0) {
    iVar11 = ~x + this->m_blocks_x;
    local_50 = 0;
    local_48 = this;
    local_58 = uVar9;
    do {
      uVar5 = (ulong)this->m_num_elements_per_block;
      if (this->m_num_elements_per_block != 0) {
        local_40 = 0;
        do {
          iVar8 = this->m_blocks_x * (int)local_50;
          local_78[0].m_alpha =
               *&this->m_pElements[(uint)(((int)uVar9 + iVar8) * (int)uVar5 + (int)local_40)].
                 m_bytes;
          local_78[1].m_alpha =
               (uint8  [8])
               *(undefined8 *)
                this->m_pElements[(uint)((iVar8 + iVar11) * (int)uVar5 + (int)local_40)].m_bytes;
          local_60 = local_78[0].m_alpha + 4;
          lVar14 = 0;
          do {
            eVar4 = this->m_element_type[local_40];
            local_38 = lVar14;
            if (eVar4 == cAlphaDXT5) {
              iVar10 = 9;
              iVar12 = 0;
              iVar8 = 0;
              do {
                iVar15 = 0;
                do {
                  uVar17 = (ulong)((uint)(iVar12 + iVar15) >> 3);
                  uVar2 = local_78[lVar14].m_alpha[uVar17 + 2];
                  uVar3 = local_78[lVar14].m_alpha[uVar17 + 3];
                  bVar7 = (byte)(iVar12 + iVar15) & 7;
                  uVar13 = iVar10 + iVar15;
                  uVar5 = (ulong)(uVar13 >> 3);
                  uVar16 = (uint)local_78[lVar14].m_alpha[uVar5 + 2];
                  if (uVar13 < 0x28) {
                    uVar16 = (uint)CONCAT11(local_78[lVar14].m_alpha[uVar5 + 3],
                                            local_78[lVar14].m_alpha[uVar5 + 2]);
                  }
                  bVar6 = (byte)uVar13 & 7;
                  *(ushort *)(local_78[lVar14].m_alpha + uVar17 + 2) =
                       (ushort)((uVar16 >> bVar6 & 7) << bVar7) |
                       ~(ushort)(7 << bVar7) & CONCAT11(local_78[lVar14].m_alpha[uVar17 + 3],uVar2);
                  uVar16 = (uint)local_78[lVar14].m_alpha[uVar5 + 2];
                  if (uVar13 < 0x28) {
                    uVar16 = (uint)CONCAT11(local_78[lVar14].m_alpha[uVar5 + 3],
                                            local_78[lVar14].m_alpha[uVar5 + 2]);
                  }
                  uVar16 = ((ushort)(CONCAT11(uVar3,uVar2) >> bVar7) & 7) << bVar6 |
                           ~(7 << bVar6) & uVar16;
                  local_78[lVar14].m_alpha[uVar5 + 2] = (uint8)uVar16;
                  if (uVar13 < 0x28) {
                    local_78[lVar14].m_alpha[uVar5 + 3] = (uint8)(uVar16 >> 8);
                  }
                  iVar15 = iVar15 + 0xc;
                } while (iVar15 != 0x30);
                iVar8 = iVar8 + 1;
                iVar10 = iVar10 + -3;
                iVar12 = iVar12 + 3;
              } while (iVar8 != 2);
            }
            else if (eVar4 == cAlphaDXT3) {
              this_00 = local_78 + lVar14;
              x_00 = 0;
              do {
                y_00 = 0;
                do {
                  value = dxt3_block::get_alpha(this_00,x_00,y_00,false);
                  value_00 = dxt3_block::get_alpha(this_00,3 - x_00,y_00,false);
                  dxt3_block::set_alpha(this_00,x_00,y_00,value_00,false);
                  dxt3_block::set_alpha(this_00,3 - x_00,y_00,value,false);
                  y_00 = y_00 + 1;
                } while (y_00 != 4);
                x_00 = x_00 + 1;
              } while (x_00 != 2);
            }
            else if (eVar4 == cColorDXT1) {
              iVar8 = 0;
              do {
                bVar7 = (char)iVar8 * '\x02';
                bVar6 = (char)iVar8 * -2 + 6;
                lVar14 = 0;
                do {
                  bVar1 = local_60[lVar14];
                  local_60[lVar14] =
                       (byte)((bVar1 >> (bVar7 & 0x1f) & 3) << (bVar6 & 0x1f)) |
                       ((byte)((bVar1 >> (bVar6 & 0x1f) & 3) << (bVar7 & 0x1f)) |
                       bVar1 & ~(byte)(3 << (bVar7 & 0x1f))) & ~(byte)(3 << (bVar6 & 0x1f));
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 4);
                iVar8 = iVar8 + 1;
              } while (iVar8 != 2);
            }
            lVar14 = local_38 + 1;
            local_60 = local_60 + 8;
            this = local_48;
          } while (local_38 == 0);
          *&local_48->m_pElements
            [(local_48->m_blocks_x * (int)local_50 + (int)local_58) *
             local_48->m_num_elements_per_block + (int)local_40].m_bytes = local_78[1].m_alpha;
          *&local_48->m_pElements
            [(local_48->m_blocks_x * (int)local_50 + iVar11) * local_48->m_num_elements_per_block +
             (int)local_40].m_bytes = local_78[0].m_alpha;
          local_40 = local_40 + 1;
          uVar5 = (ulong)local_48->m_num_elements_per_block;
          uVar9 = local_58;
        } while (local_40 < uVar5);
      }
      uVar13 = (int)local_50 + 1;
      local_50 = (ulong)uVar13;
    } while (uVar13 < this->m_blocks_y);
  }
  return;
}

Assistant:

void dxt_image::flip_col(uint x)
    {
        const uint other_x = (m_blocks_x - 1) - x;
        for (uint y = 0; y < m_blocks_y; y++)
        {
            for (uint e = 0; e < get_elements_per_block(); e++)
            {
                element tmp[2] = { get_element(x, y, e), get_element(other_x, y, e) };

                for (uint i = 0; i < 2; i++)
                {
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp[i])->flip_x();
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                }

                get_element(x, y, e) = tmp[1];
                get_element(other_x, y, e) = tmp[0];
            }
        }
    }